

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O2

BCReg rec_mm_prep(jit_State *J,ASMFunction cont)

{
  byte bVar1;
  TValue *pTVar2;
  TRef *pTVar3;
  TRef TVar4;
  ulong uVar5;
  ulong uVar6;
  
  pTVar2 = J->L->base;
  bVar1 = *(byte *)((ulong)*(uint *)((ulong)pTVar2[-1].u32.lo + 0x10) - 0x39);
  uVar6 = (ulong)bVar1;
  pTVar2[uVar6].u64 = (uint64_t)(cont + -0x146170);
  TVar4 = lj_ir_kptr_(J,IR_KPTR,cont + -0x146170);
  pTVar3 = J->base;
  pTVar3[uVar6] = TVar4 | 0x20000;
  J->framedepth = J->framedepth + 1;
  for (uVar5 = (ulong)J->maxslot; uVar5 < uVar6; uVar5 = uVar5 + 1) {
    pTVar3[uVar5] = 0;
  }
  return bVar1 + 1;
}

Assistant:

static BCReg rec_mm_prep(jit_State *J, ASMFunction cont)
{
  BCReg s, top = curr_proto(J->L)->framesize;
  TRef trcont;
  setcont(&J->L->base[top], cont);
#if LJ_64
  trcont = lj_ir_kptr(J, (void *)((int64_t)cont - (int64_t)lj_vm_asm_begin));
#else
  trcont = lj_ir_kptr(J, (void *)cont);
#endif
  J->base[top] = trcont | TREF_CONT;
  J->framedepth++;
  for (s = J->maxslot; s < top; s++)
    J->base[s] = 0;  /* Clear frame gap to avoid resurrecting previous refs. */
  return top+1;
}